

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O2

REF_STATUS
ref_gather_scalar_by_extension
          (REF_GRID ref_grid,REF_INT ldim,REF_DBL *scalar,char **scalar_names,char *filename)

{
  REF_CELL pRVar1;
  void *pvVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  REF_STATUS RVar7;
  size_t sVar8;
  FILE *pFVar9;
  REF_NODE pRVar10;
  void *pvVar11;
  size_t sVar12;
  long lVar13;
  ulong uVar14;
  undefined8 uVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  REF_INT RVar19;
  char *pcVar20;
  REF_MPI pRVar21;
  REF_STATUS ref_private_macro_code_rxs;
  bool bVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  ulong uStackY_1a0;
  REF_LONG ncell;
  REF_GLOB *l2c;
  REF_INT min_id;
  size_t local_160;
  REF_NODE local_158;
  int dof;
  FILE *local_148;
  void *local_140;
  int local_138;
  int length;
  void *local_130;
  void *local_128;
  ulong local_120;
  long local_118;
  int local_10c;
  undefined4 local_108;
  int version;
  ulong local_100;
  long local_f8;
  REF_MPI local_f0;
  long local_e8;
  long local_e0;
  void *local_d8;
  long local_d0;
  long local_c8;
  void *local_c0;
  ulong local_b8;
  int local_ac;
  REF_GLOB nnode;
  undefined1 local_a0;
  
  sVar8 = strlen(filename);
  if (sVar8 < 10) {
    if (4 < sVar8) {
LAB_00156166:
      pcVar20 = filename + (sVar8 - 4);
      iVar3 = strcmp(pcVar20,".plt");
      if (iVar3 == 0) {
        uVar4 = ref_gather_scalar_plt(ref_grid,ldim,scalar,scalar_names,0,filename);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x1124,"ref_gather_scalar_by_extension",(ulong)uVar4,"scalar tec");
          return uVar4;
        }
        return 0;
      }
      iVar3 = strcmp(pcVar20,".tec");
      if (iVar3 != 0) {
        iVar3 = strcmp(pcVar20,".dat");
        bVar22 = true;
        if (iVar3 != 0) goto LAB_001561c3;
      }
LAB_001562bc:
      pRVar10 = ref_grid->node;
      if (ref_grid->mpi->id == 0) {
        pFVar9 = fopen(filename,"w");
        if (pFVar9 != (FILE *)0x0) {
          fwrite("title=\"tecplot refine gather\"\n",0x1e,1,pFVar9);
          fwrite("variables = \"x\" \"y\" \"z\"",0x17,1,pFVar9);
          uVar14 = 0;
          if (0 < ldim) {
            uVar14 = (ulong)(uint)ldim;
          }
          if (scalar_names == (char **)0x0) {
            for (uVar4 = 1; uVar4 - (int)uVar14 != 1; uVar4 = uVar4 + 1) {
              fprintf(pFVar9," \"V%d\"",(ulong)uVar4);
            }
          }
          else {
            for (uVar18 = 0; uVar14 != uVar18; uVar18 = uVar18 + 1) {
              fprintf(pFVar9," \"%s\"",scalar_names[uVar18]);
            }
          }
          fputc(10,pFVar9);
          goto LAB_0015670a;
        }
        printf("unable to open %s\n",filename);
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0xd40,"ref_gather_scalar_tec","unable to open file");
        uStackY_1a0 = 2;
      }
      else {
        pFVar9 = (FILE *)0x0;
LAB_0015670a:
        uVar4 = ref_node_synchronize_globals(pRVar10);
        if (uVar4 == 0) {
          uVar4 = ref_grid_faceid_range(ref_grid,&min_id,&dof);
          if (uVar4 == 0) {
            for (uVar4 = min_id; (int)uVar4 <= dof; uVar4 = uVar4 + 1) {
              pRVar1 = ref_grid->cell[3];
              uVar5 = ref_grid_compact_cell_id_nodes(ref_grid,pRVar1,uVar4,&nnode,&ncell,&l2c);
              if (uVar5 != 0) {
                uStackY_1a0 = (ulong)uVar5;
                pcVar20 = "l2c";
                uVar15 = 0xd53;
                goto LAB_00156776;
              }
              if (0 < CONCAT44(ncell._4_4_,(uint)ncell) && 0 < nnode) {
                if (ref_grid->mpi->id == 0) {
                  fprintf(pFVar9,
                          "zone t=\"tri%d\", nodes=%ld, elements=%ld, datapacking=%s, zonetype=%s\n"
                          ,(ulong)uVar4,nnode,CONCAT44(ncell._4_4_,(uint)ncell),"point","fetriangle"
                         );
                }
                uVar5 = ref_gather_node_tec_part
                                  (pRVar10,nnode,(REF_GLOB *)CONCAT44(l2c._4_4_,(int)l2c),ldim,
                                   scalar,(FILE *)pFVar9);
                if (uVar5 != 0) {
                  uStackY_1a0 = (ulong)uVar5;
                  pcVar20 = "nodes";
                  uVar15 = 0xd5d;
                  goto LAB_00156776;
                }
                uVar5 = ref_gather_cell_id_tec
                                  (pRVar10,pRVar1,uVar4,CONCAT44(ncell._4_4_,(uint)ncell),
                                   (REF_GLOB *)CONCAT44(l2c._4_4_,(int)l2c),0,(FILE *)pFVar9);
                if (uVar5 != 0) {
                  uStackY_1a0 = (ulong)uVar5;
                  pcVar20 = "t";
                  uVar15 = 0xd60;
                  goto LAB_00156776;
                }
              }
              free((void *)CONCAT44(l2c._4_4_,(int)l2c));
              pRVar1 = ref_grid->cell[6];
              uVar5 = ref_grid_compact_cell_id_nodes(ref_grid,pRVar1,uVar4,&nnode,&ncell,&l2c);
              if (uVar5 != 0) {
                uStackY_1a0 = (ulong)uVar5;
                pcVar20 = "l2c";
                uVar15 = 0xd67;
                goto LAB_00156776;
              }
              if (0 < CONCAT44(ncell._4_4_,(uint)ncell) && 0 < nnode) {
                if (ref_grid->mpi->id == 0) {
                  fprintf(pFVar9,
                          "zone t=\"quad%d\", nodes=%ld, elements=%ld, datapacking=%s, zonetype=%s\n"
                          ,(ulong)uVar4,nnode,CONCAT44(ncell._4_4_,(uint)ncell),"point",
                          "fequadrilateral");
                }
                uVar5 = ref_gather_node_tec_part
                                  (pRVar10,nnode,(REF_GLOB *)CONCAT44(l2c._4_4_,(int)l2c),ldim,
                                   scalar,(FILE *)pFVar9);
                if (uVar5 != 0) {
                  uStackY_1a0 = (ulong)uVar5;
                  pcVar20 = "nodes";
                  uVar15 = 0xd71;
                  goto LAB_00156776;
                }
                uVar5 = ref_gather_cell_id_tec
                                  (pRVar10,pRVar1,uVar4,CONCAT44(ncell._4_4_,(uint)ncell),
                                   (REF_GLOB *)CONCAT44(l2c._4_4_,(int)l2c),0,(FILE *)pFVar9);
                if (uVar5 != 0) {
                  uStackY_1a0 = (ulong)uVar5;
                  pcVar20 = "t";
                  uVar15 = 0xd74;
                  goto LAB_00156776;
                }
              }
              free((void *)CONCAT44(l2c._4_4_,(int)l2c));
            }
            pRVar1 = ref_grid->cell[8];
            uVar4 = ref_grid_compact_cell_nodes(ref_grid,pRVar1,&nnode,&ncell,&l2c);
            if (uVar4 == 0) {
              if (CONCAT44(ncell._4_4_,(uint)ncell) < 1 || nnode < 1) {
LAB_001580fd:
                free((void *)CONCAT44(l2c._4_4_,(int)l2c));
                goto LAB_00158107;
              }
              if (ref_grid->mpi->id == 0) {
                fprintf(pFVar9,
                        "zone t=\"tet\", nodes=%ld, elements=%ld, datapacking=%s, zonetype=%s\n",
                        nnode,CONCAT44(ncell._4_4_,(uint)ncell),"point","fetetrahedron");
              }
              uVar4 = ref_gather_node_tec_part
                                (pRVar10,nnode,(REF_GLOB *)CONCAT44(l2c._4_4_,(int)l2c),ldim,scalar,
                                 (FILE *)pFVar9);
              if (uVar4 == 0) {
                uVar4 = ref_gather_cell_tec(pRVar10,pRVar1,CONCAT44(ncell._4_4_,(uint)ncell),
                                            (REF_GLOB *)CONCAT44(l2c._4_4_,(int)l2c),0,
                                            (FILE *)pFVar9);
                if (uVar4 == 0) goto LAB_001580fd;
                uStackY_1a0 = (ulong)uVar4;
                pcVar20 = "t";
                uVar15 = 0xd87;
              }
              else {
                uStackY_1a0 = (ulong)uVar4;
                pcVar20 = "nodes";
                uVar15 = 0xd85;
              }
            }
            else {
              uStackY_1a0 = (ulong)uVar4;
              pcVar20 = "l2c";
              uVar15 = 0xd7b;
            }
          }
          else {
            uStackY_1a0 = (ulong)uVar4;
            pcVar20 = "range";
            uVar15 = 0xd4d;
          }
        }
        else {
          uStackY_1a0 = (ulong)uVar4;
          pcVar20 = "sync";
          uVar15 = 0xd4b;
        }
LAB_00156776:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               uVar15,"ref_gather_scalar_tec",uStackY_1a0,pcVar20);
      }
      pcVar20 = "scalar tec";
      uVar15 = 0x112d;
LAB_00156a63:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             uVar15,"ref_gather_scalar_by_extension",uStackY_1a0,pcVar20);
      return (REF_STATUS)uStackY_1a0;
    }
    if (sVar8 < 3) goto LAB_001564df;
    bVar22 = false;
LAB_001561c3:
    pcVar20 = filename + sVar8;
    if (((filename[sVar8 - 2] == '.') && (pcVar20[-1] == 't')) && (*pcVar20 == '\0'))
    goto LAB_001562bc;
    if (!bVar22) {
LAB_00156218:
      if ((sVar8 < 0xd) || (iVar3 = strcmp(pcVar20 + -0xc,".restart_sol"), iVar3 != 0)) {
        if ((bVar22) && (iVar3 = strcmp(pcVar20 + -4,".sol"), iVar3 == 0)) {
          uVar4 = ref_node_synchronize_globals(ref_grid->node);
          if (uVar4 == 0) {
            pRVar21 = ref_grid->mpi;
            if (pRVar21->id != 0) {
              pFVar9 = (FILE *)0x0;
LAB_00157482:
              pRVar10 = ref_grid->node;
              uVar4 = ref_node_synchronize_globals(pRVar10);
              if (uVar4 == 0) {
                if (pRVar21->id == 0) {
                  iVar3 = ref_grid->twod;
                  fprintf(pFVar9,"MeshVersionFormatted %d\n\n",2);
                  fprintf(pFVar9,"Dimension %d\n\n",(ulong)((iVar3 == 0) + 2));
                  if (pRVar21->id == 0) {
                    fwrite("SolAtVertices\n",0xe,1,pFVar9);
                    fprintf(pFVar9,"%ld\n",pRVar10->old_n_global);
                    fprintf(pFVar9,"%d",ldim);
                    iVar3 = 0;
                    if (0 < ldim) {
                      iVar3 = ldim;
                    }
                    while (iVar3 != 0) {
                      fprintf(pFVar9," %d",1);
                      iVar3 = iVar3 + -1;
                    }
                    fputc(10,pFVar9);
                  }
                }
                uVar4 = ref_gather_node_scalar_txt(pRVar10,ldim,scalar," ",0,(FILE *)pFVar9);
                if (uVar4 == 0) {
                  if (pRVar21->id == 0) {
                    fwrite("\nEnd\n",5,1,pFVar9);
                  }
                  iVar3 = ref_grid->mpi->id;
                  goto joined_r0x00157c95;
                }
                pcVar20 = "txt dump in solb";
                uVar15 = 0x77f;
              }
              else {
                pcVar20 = "sync";
                uVar15 = 0x768;
              }
              uStackY_1a0 = (ulong)uVar4;
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,uVar15,"ref_gather_node_scalar_sol",uStackY_1a0,pcVar20);
              pcVar20 = "nodes";
              uVar15 = 0xc46;
              goto LAB_0015804e;
            }
            pFVar9 = fopen(filename,"w");
            if (pFVar9 != (FILE *)0x0) {
              pRVar21 = ref_grid->mpi;
              goto LAB_00157482;
            }
            printf("unable to open %s\n",filename);
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0xc43,"ref_gather_scalar_sol","unable to open file");
            uStackY_1a0 = 2;
          }
          else {
            uStackY_1a0 = (ulong)uVar4;
            pcVar20 = "sync";
            uVar15 = 0xc3d;
LAB_0015804e:
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,uVar15,"ref_gather_scalar_sol",uStackY_1a0,pcVar20);
          }
          pcVar20 = "scalar sol";
          uVar15 = 0x1140;
          goto LAB_00156a63;
        }
        if (sVar8 < 0x10) {
          if (5 < sVar8) goto LAB_00156474;
        }
        else {
          iVar3 = strcmp(pcVar20 + -0xf,"-usm3dcell.solb");
          if (iVar3 == 0) {
            uVar4 = ref_gather_scalar_cell_solb(ref_grid,ldim,scalar,filename);
            if (uVar4 == 0) {
              return 0;
            }
            uStackY_1a0 = (ulong)uVar4;
            pcVar20 = "scalar usm3d cell solb";
            uVar15 = 0x1146;
            goto LAB_00156a63;
          }
LAB_00156474:
          iVar3 = strcmp(pcVar20 + -5,".solb");
          if (iVar3 == 0) {
            uVar4 = ref_node_synchronize_globals(ref_grid->node);
            if (uVar4 == 0) {
              pRVar21 = ref_grid->mpi;
              if (pRVar21->id != 0) {
                pFVar9 = (FILE *)0x0;
LAB_001574e2:
                pRVar10 = ref_grid->node;
                uVar4 = ref_node_synchronize_globals(pRVar10);
                if (uVar4 == 0) {
                  min_id = (ref_grid->twod == 0) + 2;
                  ncell._0_4_ = 2;
                  uVar4 = ref_grid->meshb_version;
                  if ((int)uVar4 < 2) {
                    if (10000000 < pRVar10->old_n_global) {
                      uVar4 = 4 - ((ulong)pRVar10->old_n_global < 0xbebc201);
                      goto LAB_001576be;
                    }
                    uVar5 = 8;
                    iVar3 = 4;
                  }
                  else {
LAB_001576be:
                    iVar3 = (uint)(3 < uVar4) * 4 + 4;
                    uVar5 = (uint)(2 < uVar4) * 4 + 8;
                    ncell._0_4_ = uVar4;
                  }
                  if (pRVar21->id == 0) {
                    local_158 = (REF_NODE)CONCAT44(local_158._4_4_,iVar3);
                    l2c._0_4_ = 1;
                    sVar8 = fwrite(&l2c,4,1,pFVar9);
                    if (sVar8 == 1) {
                      sVar8 = fwrite(&ncell,4,1,pFVar9);
                      if (sVar8 == 1) {
                        lVar13 = ftell(pFVar9);
                        nnode = CONCAT44(nnode._4_4_,3);
                        sVar8 = fwrite(&nnode,4,1,pFVar9);
                        uVar4 = (uint)ncell;
                        if (sVar8 == 1) {
                          local_160 = (ulong)uVar5 + lVar13 + 4;
                          uVar6 = ref_export_meshb_next_position
                                            ((FILE *)pFVar9,(uint)ncell,local_160);
                          if (uVar6 != 0) {
                            uStackY_1a0 = (ulong)uVar6;
                            pcVar20 = "next p";
                            uVar15 = 0x738;
                            goto LAB_00157519;
                          }
                          sVar8 = fwrite(&min_id,4,1,pFVar9);
                          if (sVar8 == 1) {
                            sVar8 = ftell(pFVar9);
                            if (local_160 == sVar8) {
                              uStackY_1a0 = local_160;
                              if (pRVar21->id != 0) goto LAB_00157dc9;
                              lVar13 = pRVar10->old_n_global;
                              local_160 = ftell(pFVar9);
                              nnode = CONCAT44(nnode._4_4_,0x3e);
                              sVar8 = fwrite(&nnode,4,1,pFVar9);
                              if (sVar8 == 1) {
                                local_160 = local_160 +
                                            (long)(ldim * 4) + (ulong)(uVar5 + (int)local_158) +
                                            (ldim * 8) * lVar13 + 4;
                                uVar5 = ref_export_meshb_next_position
                                                  ((FILE *)pFVar9,uVar4,local_160);
                                if (uVar5 == 0) {
                                  RVar7 = ref_gather_meshb_glob
                                                    ((FILE *)pFVar9,uVar4,pRVar10->old_n_global);
                                  if (RVar7 == 0) {
                                    nnode = CONCAT44(nnode._4_4_,ldim);
                                    sVar8 = fwrite(&nnode,4,1,pFVar9);
                                    if (sVar8 == 1) {
                                      iVar3 = 0;
                                      if (0 < ldim) {
                                        iVar3 = ldim;
                                      }
                                      nnode = CONCAT44(nnode._4_4_,1);
                                      iVar3 = iVar3 + 1;
                                      do {
                                        iVar3 = iVar3 + -1;
                                        uStackY_1a0 = local_160;
                                        if (iVar3 == 0) goto LAB_00157dc9;
                                        sVar8 = fwrite(&nnode,4,1,pFVar9);
                                      } while (sVar8 == 1);
                                      pcVar20 = "scalar";
                                      uStackY_1a0 = 1;
                                      uVar15 = 0x74b;
                                    }
                                    else {
                                      pcVar20 = "n solutions";
                                      uStackY_1a0 = 1;
                                      uVar15 = 0x748;
                                    }
                                    goto LAB_001582b2;
                                  }
                                  pcVar20 = "nnode";
                                  uStackY_1a0 = 1;
                                  uVar15 = 0x746;
                                }
                                else {
                                  uStackY_1a0 = (ulong)uVar5;
                                  pcVar20 = "next p";
                                  uVar15 = 0x744;
                                }
                                goto LAB_00157519;
                              }
                              pcVar20 = "vertex version code";
                              uStackY_1a0 = 1;
                              uVar15 = 0x743;
                            }
                            else {
                              pcVar20 = "dim inconsistent";
                              uVar15 = 0x73a;
                              uStackY_1a0 = local_160;
                            }
                          }
                          else {
                            pcVar20 = "dim";
                            uStackY_1a0 = 1;
                            uVar15 = 0x739;
                          }
                        }
                        else {
                          pcVar20 = "dim code";
                          uStackY_1a0 = 1;
                          uVar15 = 0x737;
                        }
                      }
                      else {
                        pcVar20 = "version";
                        uStackY_1a0 = 1;
                        uVar15 = 0x734;
                      }
                    }
                    else {
                      pcVar20 = "code";
                      uStackY_1a0 = 1;
                      uVar15 = 0x733;
                    }
                    goto LAB_001582b2;
                  }
                  uStackY_1a0 = 0;
                  uVar4 = (uint)ncell;
LAB_00157dc9:
                  uVar5 = ref_gather_node_scalar_bin(pRVar10,ldim,scalar,(FILE *)pFVar9);
                  if (uVar5 != 0) {
                    uStackY_1a0 = (ulong)uVar5;
                    pcVar20 = "bin dump in solb";
                    uVar15 = 0x750;
                    goto LAB_00157519;
                  }
                  if (pRVar21->id == 0) {
                    sVar8 = ftell(pFVar9);
                    if (uStackY_1a0 != sVar8) {
                      pcVar20 = "solb metric record len inconsistent";
                      uVar15 = 0x753;
LAB_001582b2:
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                             ,uVar15,"ref_gather_node_scalar_solb",pcVar20,uStackY_1a0,sVar8);
                      uStackY_1a0 = 1;
                      goto LAB_00157523;
                    }
                    if (pRVar21->id == 0) {
                      nnode = CONCAT44(nnode._4_4_,0x36);
                      sVar8 = fwrite(&nnode,4,1,pFVar9);
                      if (sVar8 != 1) {
                        pcVar20 = "end kw";
                        uStackY_1a0 = 1;
                        uVar15 = 0x757;
                        goto LAB_001582b2;
                      }
                      uVar4 = ref_export_meshb_next_position((FILE *)pFVar9,uVar4,0);
                      if (uVar4 != 0) {
                        uStackY_1a0 = (ulong)uVar4;
                        pcVar20 = "next p";
                        uVar15 = 0x759;
                        goto LAB_00157519;
                      }
                    }
                  }
                  iVar3 = ref_grid->mpi->id;
                  goto joined_r0x00157c95;
                }
                uStackY_1a0 = (ulong)uVar4;
                pcVar20 = "sync";
                uVar15 = 0x71e;
LAB_00157519:
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                       ,uVar15,"ref_gather_node_scalar_solb",uStackY_1a0,pcVar20);
LAB_00157523:
                pcVar20 = "nodes";
                uVar15 = 0xc08;
                goto LAB_00157544;
              }
              pFVar9 = fopen(filename,"w");
              if (pFVar9 != (FILE *)0x0) {
                pRVar21 = ref_grid->mpi;
                goto LAB_001574e2;
              }
              printf("unable to open %s\n",filename);
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,0xc05,"ref_gather_scalar_solb","unable to open file");
              uStackY_1a0 = 2;
            }
            else {
              uStackY_1a0 = (ulong)uVar4;
              pcVar20 = "sync";
              uVar15 = 0xbff;
LAB_00157544:
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                     ,uVar15,"ref_gather_scalar_solb",uStackY_1a0,pcVar20);
            }
            pcVar20 = "scalar solb";
            uVar15 = 0x114b;
            goto LAB_00156a63;
          }
        }
        if (!bVar22) {
LAB_001564df:
          printf("%s: %d: %s %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x115c,"input file name extension unknown",filename);
          return 1;
        }
        pcVar20 = pcVar20 + -4;
        iVar3 = strcmp(pcVar20,".bin");
        if (iVar3 != 0) {
          iVar3 = strcmp(pcVar20,".txt");
          if (iVar3 == 0) {
            uVar4 = ref_gather_scalar_txt(ref_grid,ldim,scalar," ",filename);
            if (uVar4 == 0) {
              return 0;
            }
            uStackY_1a0 = (ulong)uVar4;
            pcVar20 = "scalar txt";
            uVar15 = 0x1154;
          }
          else {
            iVar3 = strcmp(pcVar20,".csv");
            if (iVar3 != 0) goto LAB_001564df;
            uVar4 = ref_gather_scalar_txt(ref_grid,ldim,scalar,",",filename);
            if (uVar4 == 0) {
              return 0;
            }
            uStackY_1a0 = (ulong)uVar4;
            pcVar20 = "scalar txt";
            uVar15 = 0x1159;
          }
          goto LAB_00156a63;
        }
        pRVar10 = ref_grid->node;
        uVar4 = ref_node_synchronize_globals(pRVar10);
        if (uVar4 == 0) {
          if (ref_grid->mpi->id != 0) {
            pFVar9 = (FILE *)0x0;
LAB_00157a10:
            uVar4 = ref_gather_node_scalar_bin(pRVar10,ldim,scalar,(FILE *)pFVar9);
            if (uVar4 == 0) {
              iVar3 = ref_grid->mpi->id;
joined_r0x00157c95:
              if (iVar3 == 0) {
                fclose(pFVar9);
                return 0;
              }
              return 0;
            }
            pcVar20 = "nodes";
            uVar15 = 0xbf2;
            goto LAB_00157a4a;
          }
          pFVar9 = fopen(filename,"w");
          if (pFVar9 != (FILE *)0x0) goto LAB_00157a10;
          uStackY_1a0 = 2;
          printf("unable to open %s\n",filename);
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0xbef,"ref_gather_scalar_bin","unable to open file");
        }
        else {
          pcVar20 = "sync";
          uVar15 = 0xbe9;
LAB_00157a4a:
          uStackY_1a0 = (ulong)uVar4;
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 uVar15,"ref_gather_scalar_bin",uStackY_1a0,pcVar20);
        }
        pcVar20 = "scalar bin";
        uVar15 = 0x114f;
        goto LAB_00156a63;
      }
      if (ref_grid->mpi->n < 2) {
        if (ldim != 5) {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0xc17,"ref_gather_scalar_cell_restart_sol","only implemented for ldim=5",5,
                 (long)ldim);
          goto LAB_00157189;
        }
        pRVar1 = ref_grid->cell[3];
        pFVar9 = fopen(filename,"w");
        if (pFVar9 != (FILE *)0x0) {
          fprintf(pFVar9,"%d\n",(ulong)(uint)pRVar1->n);
          for (iVar3 = 0; iVar3 < pRVar1->max; iVar3 = iVar3 + 1) {
            RVar7 = ref_cell_nodes(pRVar1,iVar3,(REF_INT *)&nnode);
            if (RVar7 == 0) {
              uVar4 = pRVar1->node_per;
              uVar14 = 0;
              if (0 < (int)uVar4) {
                uVar14 = (ulong)uVar4;
              }
              dVar23 = 0.0;
              dVar24 = 0.0;
              dVar25 = 0.0;
              for (uVar18 = 0; uVar14 != uVar18; uVar18 = uVar18 + 1) {
                lVar13 = (long)*(int *)((long)&nnode + uVar18 * 4);
                dVar25 = dVar25 + scalar[lVar13 * 5 + 3];
                dVar23 = dVar23 + scalar[lVar13 * 5];
                dVar24 = dVar24 + (scalar + lVar13 * 5)[1];
              }
              dVar26 = (double)(int)uVar4;
              fprintf(pFVar9,"%.15e %.15e %.15e %.15e\n",dVar23 / dVar26,dVar24 / dVar26,
                      dVar25 / dVar26);
            }
          }
          goto LAB_00158118;
        }
        printf("unable to open %s\n",filename);
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0xc1b,"ref_gather_scalar_cell_restart_sol","unable to open file");
        uStackY_1a0 = 2;
      }
      else {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0xc16,"ref_gather_scalar_cell_restart_sol","only implemented for single core");
LAB_00157189:
        uStackY_1a0 = 1;
      }
      pcVar20 = "scalar sol";
      uVar15 = 0x113c;
      goto LAB_00156a63;
    }
    iVar3 = strcmp(pcVar20 + -4,".pcd");
    if (iVar3 == 0) {
      pRVar10 = ref_grid->node;
      uVar4 = ref_node_synchronize_globals(pRVar10);
      if (uVar4 == 0) {
        if (ref_grid->mpi->id != 0) {
          pFVar9 = (FILE *)0x0;
LAB_00157c12:
          uVar4 = ref_gather_node_scalar_txt(pRVar10,ldim,scalar," ",1,(FILE *)pFVar9);
          if (uVar4 == 0) {
            iVar3 = ref_grid->mpi->id;
            goto joined_r0x00157c95;
          }
          pcVar20 = "text export";
          uVar15 = 0xd28;
          goto LAB_00157c57;
        }
        local_158 = pRVar10;
        pFVar9 = fopen(filename,"w");
        if (pFVar9 != (FILE *)0x0) {
          fwrite("# .PCD v.7 - Point Cloud Data file format\n",0x2a,1,pFVar9);
          fwrite("VERSION .7\n",0xb,1,pFVar9);
          fwrite("FIELDS x y z",0xc,1,pFVar9);
          uVar14 = 0;
          if (0 < ldim) {
            uVar14 = (ulong)(uint)ldim;
          }
          if (scalar_names == (char **)0x0) {
            for (uVar4 = 1; uVar4 - (int)uVar14 != 1; uVar4 = uVar4 + 1) {
              fprintf(pFVar9," V%d",(ulong)uVar4);
            }
          }
          else {
            for (uVar18 = 0; uVar14 != uVar18; uVar18 = uVar18 + 1) {
              fprintf(pFVar9," %s",scalar_names[uVar18]);
            }
          }
          fputc(10,pFVar9);
          fwrite("SIZE",4,1,pFVar9);
          iVar3 = -3;
          if (-3 < ldim) {
            iVar3 = ldim;
          }
          iVar3 = iVar3 + 3;
          iVar17 = iVar3;
          while (bVar22 = iVar17 != 0, iVar17 = iVar17 + -1, bVar22) {
            fwrite(" 4",2,1,pFVar9);
          }
          fputc(10,pFVar9);
          fwrite("TYPE",4,1,pFVar9);
          iVar17 = iVar3;
          while (bVar22 = iVar17 != 0, iVar17 = iVar17 + -1, bVar22) {
            fwrite(" F",2,1,pFVar9);
          }
          fputc(10,pFVar9);
          fwrite("COUNT",5,1,pFVar9);
          while (bVar22 = iVar3 != 0, iVar3 = iVar3 + -1, bVar22) {
            fwrite(" 1",2,1,pFVar9);
          }
          fputc(10,pFVar9);
          pRVar10 = local_158;
          fprintf(pFVar9,"WIDTH %ld\n",local_158->old_n_global);
          fwrite("VIEWPOINT 0 0 0 1 0 0 0\n",0x18,1,pFVar9);
          fprintf(pFVar9,"POINTS %ld\n",pRVar10->old_n_global);
          fwrite("DATA ascii\n",0xb,1,pFVar9);
          goto LAB_00157c12;
        }
        printf("unable to open %s\n",filename);
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0xd0e,"ref_gather_scalar_pcd","unable to open file");
        uStackY_1a0 = 2;
      }
      else {
        pcVar20 = "sync";
        uVar15 = 0xd08;
LAB_00157c57:
        uStackY_1a0 = (ulong)uVar4;
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               uVar15,"ref_gather_scalar_pcd",uStackY_1a0,pcVar20);
      }
      pcVar20 = "scalar pcd";
      uVar15 = 0x1132;
      goto LAB_00156a63;
    }
    iVar3 = strcmp(pcVar20 + -4,".rst");
    if (iVar3 != 0) goto LAB_00156218;
    pRVar21 = ref_grid->mpi;
    pRVar10 = ref_grid->node;
    uVar4 = ref_node_synchronize_globals(pRVar10);
    if (uVar4 != 0) {
      uStackY_1a0 = (ulong)uVar4;
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x60d,"ref_gather_scalar_rst",(ulong)uVar4,"sync");
LAB_0015737b:
      pcVar20 = "scalar rst";
      uVar15 = 0x1136;
      goto LAB_00156a63;
    }
    uStackY_1a0 = 2;
    min_id = 2;
    ncell._0_4_ = ldim / 2;
    if ((uint)ncell * 2 != ldim) {
      sVar12 = (size_t)(int)((uint)ncell * 2);
      sVar8 = (size_t)ldim;
      pcVar20 = "ldim not divisble by steps";
      uVar15 = 0x610;
LAB_00157371:
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             uVar15,"ref_gather_scalar_rst",pcVar20,sVar8,sVar12);
LAB_00157378:
      uStackY_1a0 = 1;
      goto LAB_0015737b;
    }
    sVar8 = pRVar10->old_n_global;
    dof = (int)sVar8;
    if (ref_grid->mpi->id == 0) {
      length = 8;
      nnode = 0x5453524546464f43;
      local_a0 = 0;
      version = 2;
      local_108 = 0;
      pFVar9 = fopen(filename,"w");
      if (pFVar9 == (FILE *)0x0) {
        printf("unable to open %s\n",filename);
        pcVar20 = "unable to open file";
        uVar15 = 0x61d;
        goto LAB_00157fb6;
      }
      sVar12 = fwrite(&length,4,1,pFVar9);
      if (sVar12 == 1) {
        sVar8 = (size_t)length;
        sVar12 = fwrite(&nnode,1,sVar8,pFVar9);
        if (sVar12 == sVar8) {
          sVar12 = fwrite(&version,4,1,pFVar9);
          if (sVar12 == 1) {
            local_ac = (ref_grid->twod == 0) + 2;
            sVar12 = fwrite(&local_ac,4,1,pFVar9);
            if (sVar12 == 1) {
              local_148 = pFVar9;
              sVar12 = fwrite(&ncell,4,1,pFVar9);
              if (sVar12 == 1) {
                sVar12 = fwrite(&min_id,4,1,local_148);
                if (sVar12 == 1) {
                  sVar12 = fwrite(&dof,4,1,local_148);
                  if (sVar12 == 1) {
                    sVar12 = fwrite(&local_108,4,1,local_148);
                    if (sVar12 == 1) {
                      sVar8 = pRVar10->old_n_global;
                      pFVar9 = local_148;
                      goto LAB_00156d0f;
                    }
                    pcVar20 = "doubles";
                    sVar8 = 1;
                    uVar15 = 0x629;
                  }
                  else {
                    pcVar20 = "dof";
                    sVar8 = 1;
                    uVar15 = 0x628;
                  }
                }
                else {
                  pcVar20 = "steps";
                  sVar8 = 1;
                  uVar15 = 0x627;
                }
              }
              else {
                pcVar20 = "variables";
                sVar8 = 1;
                uVar15 = 0x626;
              }
            }
            else {
              pcVar20 = "dim";
              sVar8 = 1;
              uVar15 = 0x625;
            }
          }
          else {
            pcVar20 = "version";
            sVar8 = 1;
            uVar15 = 0x622;
          }
        }
        else {
          pcVar20 = "magic";
          uVar15 = 0x621;
        }
      }
      else {
        pcVar20 = "length";
        sVar8 = 1;
        uVar15 = 0x61f;
      }
      goto LAB_00157371;
    }
    pFVar9 = (FILE *)0x0;
LAB_00156d0f:
    uVar4 = (uint)ncell;
    uVar6 = (int)((long)sVar8 / (long)pRVar21->n) + 1;
    uVar5 = uVar6;
    if ((0 < pRVar21->reduce_byte_limit) &&
       (uVar5 = pRVar21->reduce_byte_limit / (int)((uint)ncell * 8 + 8), (int)uVar6 < (int)uVar5)) {
      uVar5 = uVar6;
    }
    local_120 = (ulong)uVar5;
    local_138 = (uint)ncell + 1;
    if ((int)(uVar5 * local_138) < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x631,"ref_gather_scalar_rst","malloc local_xyzm of REF_DBL negative");
      goto LAB_00157378;
    }
    local_100 = (ulong)(uVar5 * local_138);
    sVar12 = local_100 * 8;
    local_160 = sVar8;
    local_158 = pRVar10;
    local_140 = malloc(sVar12);
    if (local_140 == (void *)0x0) {
      pcVar20 = "malloc local_xyzm of REF_DBL NULL";
      uVar15 = 0x631;
LAB_00157fb6:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             uVar15,"ref_gather_scalar_rst",pcVar20);
      goto LAB_0015737b;
    }
    pvVar11 = malloc(sVar12);
    if (pvVar11 == (void *)0x0) {
      pcVar20 = "malloc xyzm of REF_DBL NULL";
      uVar15 = 0x632;
      goto LAB_00157fb6;
    }
    local_c8 = (long)(int)local_120;
    lVar13 = (long)(int)uVar4;
    if ((int)uVar4 < 1) {
      uVar4 = 0;
    }
    local_b8 = (ulong)uVar4;
    local_f8 = (long)local_138;
    RVar19 = min_id;
    if (min_id < 1) {
      RVar19 = 0;
    }
    local_c0 = (void *)((long)local_140 + lVar13 * 8);
    local_d8 = (void *)((long)pvVar11 + lVar13 * 8);
    lVar16 = -1;
    if (-1 < lVar13) {
      lVar16 = lVar13;
    }
    local_e8 = local_f8 * 8;
    local_e0 = local_b8 + 1;
    uStackY_1a0 = 0;
    local_148 = pFVar9;
    local_128 = pvVar11;
    local_f0 = pRVar21;
    for (local_10c = 0; local_10c != RVar19; local_10c = local_10c + 1) {
      lVar13 = 0;
      while (uVar14 = local_160 - lVar13, uVar14 != 0 && lVar13 <= (long)local_160) {
        if (local_c8 < (long)uVar14) {
          uVar14 = local_120;
        }
        local_130 = (void *)(uVar14 & 0xffffffff);
        for (uVar18 = 0; local_100 != uVar18; uVar18 = uVar18 + 1) {
          *(undefined8 *)((long)local_140 + uVar18 * 8) = 0;
        }
        local_d0 = lVar13 + (int)uVar14;
        local_160 = uVar14 & 0xffffffff;
        if ((int)uVar14 < 1) {
          local_160 = 0;
        }
        pvVar11 = local_140;
        local_118 = lVar13;
        for (sVar8 = 0; pRVar21 = local_f0, sVar8 != local_160; sVar8 = sVar8 + 1) {
          uVar4 = ref_node_local(local_158,local_118 + sVar8,(REF_INT *)&l2c);
          if ((uVar4 != 0) && (uVar4 != 5)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x642,"ref_gather_scalar_rst",(ulong)uVar4,"node local failed");
            uStackY_1a0 = (ulong)uVar4;
          }
          if (uVar4 == 5) {
LAB_00156f7f:
            for (lVar13 = 0; lVar16 + 1 != lVar13; lVar13 = lVar13 + 1) {
              *(undefined8 *)((long)pvVar11 + lVar13 * 8) = 0;
            }
          }
          else {
            if (uVar4 != 0) {
              if ((int)uStackY_1a0 == 0) {
                return 0;
              }
              goto LAB_0015737b;
            }
            if (local_f0->id != local_158->part[(int)l2c]) goto LAB_00156f7f;
            for (uVar14 = 0; local_b8 != uVar14; uVar14 = uVar14 + 1) {
              *(REF_DBL *)((long)pvVar11 + uVar14 * 8) = scalar[(long)((int)l2c * ldim) + uVar14];
            }
            *(undefined8 *)((long)local_c0 + sVar8 * local_f8 * 8) = 0x3ff0000000000000;
          }
          pvVar11 = (void *)((long)pvVar11 + local_e8);
        }
        uVar4 = ref_mpi_sum(local_f0,local_140,local_128,(int)local_130 * local_138,3);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x650,"ref_gather_scalar_rst",(ulong)uVar4,"sum");
          uStackY_1a0 = (ulong)uVar4;
          goto LAB_0015737b;
        }
        if (pRVar21->id == 0) {
          pvVar11 = local_128;
          for (sVar8 = 0; sVar8 != local_160; sVar8 = sVar8 + 1) {
            dVar23 = *(double *)((long)local_d8 + sVar8 * local_f8 * 8) + -1.0;
            if (dVar23 <= -dVar23) {
              dVar23 = -dVar23;
            }
            lVar13 = local_e0;
            pvVar2 = pvVar11;
            if (0.1 < dVar23) {
              printf("error gather node %ld %f\n",sVar8 + local_118);
              lVar13 = local_e0;
            }
            while (local_130 = pvVar2, lVar13 + -1 != 0) {
              sVar12 = fwrite(pvVar11,8,1,local_148);
              pvVar11 = (void *)((long)pvVar11 + 8);
              lVar13 = lVar13 + -1;
              pvVar2 = local_130;
              if (sVar12 != 1) {
                pcVar20 = "s";
                uStackY_1a0 = 1;
                uVar15 = 0x65c;
                sVar8 = uStackY_1a0;
                goto LAB_00157371;
              }
            }
            pvVar11 = (void *)((long)local_130 + local_e8);
          }
        }
        lVar13 = local_d0;
        local_160 = local_158->old_n_global;
      }
    }
    free(local_128);
    free(local_140);
    iVar3 = ref_grid->mpi->id;
    pFVar9 = local_148;
  }
  else {
    iVar3 = strcmp(filename + (sVar8 - 9),"-edge.tec");
    if (iVar3 != 0) {
      if ((sVar8 != 10) && (iVar3 = strcmp(filename + (sVar8 - 10),"-brick.plt"), iVar3 == 0)) {
        uVar4 = ref_gather_scalar_plt(ref_grid,ldim,scalar,scalar_names,1,filename);
        if (uVar4 == 0) {
          return 0;
        }
        uStackY_1a0 = (ulong)uVar4;
        pcVar20 = "scalar tec";
        uVar15 = 0x111e;
        goto LAB_00156a63;
      }
      goto LAB_00156166;
    }
    pRVar21 = ref_grid->mpi;
    if (pRVar21->id == 0) {
      local_158 = ref_grid->node;
      pFVar9 = fopen(filename,"w");
      if (pFVar9 != (FILE *)0x0) {
        fwrite("title=\"tecplot refine gather\"\n",0x1e,1,pFVar9);
        fwrite("variables = \"x\" \"y\" \"z\"",0x17,1,pFVar9);
        uVar14 = 0;
        if (0 < ldim) {
          uVar14 = (ulong)(uint)ldim;
        }
        if (scalar_names == (char **)0x0) {
          for (uVar4 = 1; uVar4 - (int)uVar14 != 1; uVar4 = uVar4 + 1) {
            fprintf(pFVar9," \"V%d\"",(ulong)uVar4);
          }
        }
        else {
          for (uVar18 = 0; uVar14 != uVar18; uVar18 = uVar18 + 1) {
            fprintf(pFVar9," \"%s\"",scalar_names[uVar18]);
          }
        }
        fputc(10,pFVar9);
        pRVar10 = local_158;
        goto LAB_001569ba;
      }
      printf("unable to open %s\n",filename);
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0xda1,"ref_gather_scalar_edge_tec","unable to open file");
      uStackY_1a0 = 2;
LAB_00156a42:
      pcVar20 = "scalar edge tec";
      uVar15 = 0x1117;
      goto LAB_00156a63;
    }
    pFVar9 = (FILE *)0x0;
    pRVar10 = ref_grid->node;
LAB_001569ba:
    uVar4 = ref_node_synchronize_globals(pRVar10);
    if (uVar4 != 0) {
      uStackY_1a0 = (ulong)uVar4;
      pcVar20 = "sync";
      uVar15 = 0xdac;
LAB_00156a38:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             uVar15,"ref_gather_scalar_edge_tec",uStackY_1a0,pcVar20);
      goto LAB_00156a42;
    }
    pRVar1 = ref_grid->cell[0];
    local_158 = pRVar10;
    uVar5 = ref_cell_id_range(pRVar1,pRVar21,&min_id,&dof);
    uVar4 = min_id;
    if (uVar5 != 0) {
      uStackY_1a0 = (ulong)uVar5;
      pcVar20 = "range";
      uVar15 = 0xdaf;
      goto LAB_00156a38;
    }
    for (; (int)uVar4 <= dof; uVar4 = uVar4 + 1) {
      uVar5 = ref_grid_compact_cell_id_nodes(ref_grid,pRVar1,uVar4,&nnode,&ncell,&l2c);
      if (uVar5 != 0) {
        uStackY_1a0 = (ulong)uVar5;
        pcVar20 = "l2c";
        uVar15 = 0xdb4;
        goto LAB_00156a38;
      }
      if (0 < CONCAT44(ncell._4_4_,(uint)ncell) && 0 < nnode) {
        if (ref_grid->mpi->id == 0) {
          fprintf(pFVar9,"zone t=\"edg%d\", nodes=%ld, elements=%ld, datapacking=%s, zonetype=%s\n",
                  (ulong)uVar4,nnode,CONCAT44(ncell._4_4_,(uint)ncell),"point","felineseg");
        }
        pRVar10 = local_158;
        uVar5 = ref_gather_node_tec_part
                          (local_158,nnode,(REF_GLOB *)CONCAT44(l2c._4_4_,(int)l2c),ldim,scalar,
                           (FILE *)pFVar9);
        if (uVar5 != 0) {
          uStackY_1a0 = (ulong)uVar5;
          pcVar20 = "nodes";
          uVar15 = 0xdbe;
          goto LAB_00156a38;
        }
        uVar5 = ref_gather_cell_id_tec
                          (pRVar10,pRVar1,uVar4,CONCAT44(ncell._4_4_,(uint)ncell),
                           (REF_GLOB *)CONCAT44(l2c._4_4_,(int)l2c),0,(FILE *)pFVar9);
        if (uVar5 != 0) {
          uStackY_1a0 = (ulong)uVar5;
          pcVar20 = "t";
          uVar15 = 0xdc1;
          goto LAB_00156a38;
        }
      }
      free((void *)CONCAT44(l2c._4_4_,(int)l2c));
    }
LAB_00158107:
    iVar3 = ref_grid->mpi->id;
  }
  if (iVar3 != 0) {
    return 0;
  }
LAB_00158118:
  fclose(pFVar9);
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_gather_scalar_by_extension(REF_GRID ref_grid,
                                                  REF_INT ldim, REF_DBL *scalar,
                                                  const char **scalar_names,
                                                  const char *filename) {
  size_t end_of_string;

  end_of_string = strlen(filename);

  if (end_of_string > 9 &&
      strcmp(&filename[end_of_string - 9], "-edge.tec") == 0) {
    RSS(ref_gather_scalar_edge_tec(ref_grid, ldim, scalar, scalar_names,
                                   filename),
        "scalar edge tec");
    return REF_SUCCESS;
  }
  if (end_of_string > 10 &&
      strcmp(&filename[end_of_string - 10], "-brick.plt") == 0) {
    RSS(ref_gather_scalar_plt(ref_grid, ldim, scalar, scalar_names, REF_TRUE,
                              filename),
        "scalar tec");
    return REF_SUCCESS;
  }
  if (end_of_string > 4 && strcmp(&filename[end_of_string - 4], ".plt") == 0) {
    RSS(ref_gather_scalar_plt(ref_grid, ldim, scalar, scalar_names, REF_FALSE,
                              filename),
        "scalar tec");
    return REF_SUCCESS;
  }
  if ((end_of_string > 4 &&
       strcmp(&filename[end_of_string - 4], ".tec") == 0) ||
      (end_of_string > 4 &&
       strcmp(&filename[end_of_string - 4], ".dat") == 0) ||
      (end_of_string > 2 && strcmp(&filename[end_of_string - 2], ".t") == 0)) {
    RSS(ref_gather_scalar_tec(ref_grid, ldim, scalar, scalar_names, filename),
        "scalar tec");
    return REF_SUCCESS;
  }
  if (end_of_string > 4 && strcmp(&filename[end_of_string - 4], ".pcd") == 0) {
    RSS(ref_gather_scalar_pcd(ref_grid, ldim, scalar, scalar_names, filename),
        "scalar pcd");
    return REF_SUCCESS;
  }
  if (end_of_string > 4 && strcmp(&filename[end_of_string - 4], ".rst") == 0) {
    RSS(ref_gather_scalar_rst(ref_grid, ldim, scalar, filename), "scalar rst");
    return REF_SUCCESS;
  }
  if (end_of_string > 12 &&
      strcmp(&filename[end_of_string - 12], ".restart_sol") == 0) {
    RSS(ref_gather_scalar_cell_restart_sol(ref_grid, ldim, scalar, filename),
        "scalar sol");
    return REF_SUCCESS;
  }
  if (end_of_string > 4 && strcmp(&filename[end_of_string - 4], ".sol") == 0) {
    RSS(ref_gather_scalar_sol(ref_grid, ldim, scalar, filename), "scalar sol");
    return REF_SUCCESS;
  }
  if (end_of_string > 15 &&
      strcmp(&filename[end_of_string - 15], "-usm3dcell.solb") == 0) {
    RSS(ref_gather_scalar_cell_solb(ref_grid, ldim, scalar, filename),
        "scalar usm3d cell solb");
    return REF_SUCCESS;
  }
  if (end_of_string > 5 && strcmp(&filename[end_of_string - 5], ".solb") == 0) {
    RSS(ref_gather_scalar_solb(ref_grid, ldim, scalar, filename),
        "scalar solb");
    return REF_SUCCESS;
  }
  if (end_of_string > 4 && strcmp(&filename[end_of_string - 4], ".bin") == 0) {
    RSS(ref_gather_scalar_bin(ref_grid, ldim, scalar, filename), "scalar bin");
    return REF_SUCCESS;
  }
  if (end_of_string > 4 && strcmp(&filename[end_of_string - 4], ".txt") == 0) {
    RSS(ref_gather_scalar_txt(ref_grid, ldim, scalar, " ", filename),
        "scalar txt");
    return REF_SUCCESS;
  }
  if (end_of_string > 4 && strcmp(&filename[end_of_string - 4], ".csv") == 0) {
    RSS(ref_gather_scalar_txt(ref_grid, ldim, scalar, ",", filename),
        "scalar txt");
    return REF_SUCCESS;
  }
  printf("%s: %d: %s %s\n", __FILE__, __LINE__,
         "input file name extension unknown", filename);
  return REF_FAILURE;
}